

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_file_control(sqlite3 *db,char *zDbName,int op,void *pArg)

{
  int iVar1;
  u32 uVar2;
  int iVar3;
  Btree *p;
  Pager *pPager_00;
  sqlite3_file *psVar4;
  sqlite3_vfs *psVar5;
  int nSave;
  int iNew;
  sqlite3_file *fd;
  Pager *pPager;
  Btree *pBtree;
  int rc;
  void *pArg_local;
  int op_local;
  char *zDbName_local;
  sqlite3 *db_local;
  
  pBtree._4_4_ = 1;
  sqlite3_mutex_enter(db->mutex);
  p = sqlite3DbNameToBtree(db,zDbName);
  if (p != (Btree *)0x0) {
    sqlite3BtreeEnter(p);
    pPager_00 = sqlite3BtreePager(p);
    psVar4 = sqlite3PagerFile(pPager_00);
    if (op == 7) {
      *(sqlite3_file **)pArg = psVar4;
      pBtree._4_4_ = 0;
    }
    else if (op == 0x1b) {
      psVar5 = sqlite3PagerVfs(pPager_00);
      *(sqlite3_vfs **)pArg = psVar5;
      pBtree._4_4_ = 0;
    }
    else if (op == 0x1c) {
      psVar4 = sqlite3PagerJrnlFile(pPager_00);
      *(sqlite3_file **)pArg = psVar4;
      pBtree._4_4_ = 0;
    }
    else if (op == 0x23) {
      uVar2 = sqlite3PagerDataVersion(pPager_00);
      *(u32 *)pArg = uVar2;
      pBtree._4_4_ = 0;
    }
    else if (op == 0x26) {
      iVar1 = *pArg;
      iVar3 = sqlite3BtreeGetRequestedReserve(p);
      *(int *)pArg = iVar3;
      if ((-1 < iVar1) && (iVar1 < 0x100)) {
        sqlite3BtreeSetPageSize(p,0,iVar1,0);
      }
      pBtree._4_4_ = 0;
    }
    else {
      iVar1 = (db->busyHandler).nBusy;
      pBtree._4_4_ = sqlite3OsFileControl(psVar4,op,pArg);
      (db->busyHandler).nBusy = iVar1;
    }
    sqlite3BtreeLeave(p);
  }
  sqlite3_mutex_leave(db->mutex);
  return pBtree._4_4_;
}

Assistant:

SQLITE_API int sqlite3_file_control(sqlite3 *db, const char *zDbName, int op, void *pArg){
  int rc = SQLITE_ERROR;
  Btree *pBtree;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  pBtree = sqlite3DbNameToBtree(db, zDbName);
  if( pBtree ){
    Pager *pPager;
    sqlite3_file *fd;
    sqlite3BtreeEnter(pBtree);
    pPager = sqlite3BtreePager(pBtree);
    assert( pPager!=0 );
    fd = sqlite3PagerFile(pPager);
    assert( fd!=0 );
    if( op==SQLITE_FCNTL_FILE_POINTER ){
      *(sqlite3_file**)pArg = fd;
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_VFS_POINTER ){
      *(sqlite3_vfs**)pArg = sqlite3PagerVfs(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_JOURNAL_POINTER ){
      *(sqlite3_file**)pArg = sqlite3PagerJrnlFile(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_DATA_VERSION ){
      *(unsigned int*)pArg = sqlite3PagerDataVersion(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_RESERVE_BYTES ){
      int iNew = *(int*)pArg;
      *(int*)pArg = sqlite3BtreeGetRequestedReserve(pBtree);
      if( iNew>=0 && iNew<=255 ){
        sqlite3BtreeSetPageSize(pBtree, 0, iNew, 0);
      }
      rc = SQLITE_OK;
    }else{
      int nSave = db->busyHandler.nBusy;
      rc = sqlite3OsFileControl(fd, op, pArg);
      db->busyHandler.nBusy = nSave;
    }
    sqlite3BtreeLeave(pBtree);
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}